

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declared_entities.h
# Opt level: O0

void __thiscall Shogun::Shogun(Shogun *this)

{
  allocator local_31;
  string local_30 [32];
  Shogun *local_10;
  Shogun *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Shogibear",&local_31);
  Entity::Entity(&this->super_Entity,(string *)local_30,100);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR_act_0014acf0;
  return;
}

Assistant:

Shogun() : Entity("Shogibear", 100) 
  {
    //nop
  }